

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Firework.cpp
# Opt level: O1

bool __thiscall
Firework::initializeFirework
          (Firework *this,int startX,int endY,int explosionDiameter,int streamerColor,
          int explosionColor,Screen *screen)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = this->fireworkStage;
  if (iVar1 == 0) {
    this->fireworkStage = 1;
    refresh();
    iVar3 = -1;
    iVar2 = -1;
    if (_stdscr != 0) {
      iVar2 = *(short *)(_stdscr + 4) + 1;
    }
    screen->screenSize[0] = iVar2;
    this->currentPosition[0] = screen->screenSize[0];
    this->endPosition[1] = startX;
    this->currentPosition[1] = startX;
    refresh();
    if (_stdscr != 0) {
      iVar3 = *(short *)(_stdscr + 4) + 1;
    }
    screen->screenSize[0] = iVar3;
    this->endPosition[0] = screen->screenSize[0] - endY;
    this->explosionDiameter = explosionDiameter;
    this->streamerColor = streamerColor;
    this->explosionColor = explosionColor;
  }
  return iVar1 == 0;
}

Assistant:

bool Firework::initializeFirework(int startX, int endY, int explosionDiameter, int streamerColor, int explosionColor, Screen &screen) {
    // Check to see if the firework has already been initialized
    if(fireworkStage != UNITIALIZED){
        return false;
    }
    else {
        fireworkStage = STREAMER_STAGE;

        currentPosition[0] = screen.getScreenSizeY();
        currentPosition[1] = endPosition[1] = startX;

        endPosition[0] = screen.getScreenSizeY() - endY;

        this->explosionDiameter = explosionDiameter;

        this->streamerColor = streamerColor;
        this->explosionColor = explosionColor;

        return true;
    }
}